

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall Generator::generateStaticMetacall(Generator *this)

{
  QCommonArrayOps<FunctionDef> *this_00;
  int iVar1;
  FunctionDef *pFVar2;
  ClassDef *pCVar3;
  _Base_ptr p_Var4;
  PropertyDef *pPVar5;
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar6;
  bool bVar7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  _Rb_tree_node_base *p_Var18;
  _Rb_tree_node_base *p_Var19;
  const_iterator cVar20;
  char *pcVar21;
  ClassDef *pCVar22;
  bool bVar23;
  _Rb_tree_node_base *p_Var24;
  _Base_ptr *pp_Var25;
  FILE *pFVar26;
  char *pcVar27;
  QByteArray *pQVar28;
  long lVar29;
  byte bVar30;
  ulong uVar31;
  char *pcVar32;
  size_t __size;
  byte bVar33;
  qsizetype *lhs;
  char *pcVar34;
  ArgumentDef *a;
  ArgumentDef *pAVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  _Rb_tree_node_base *p_Var39;
  long lVar40;
  bool bVar41;
  ArgumentDef *a_1;
  ArgumentDef *pAVar42;
  bool *pbVar43;
  long in_FS_OFFSET;
  bool bVar44;
  QByteArrayView haystack;
  QByteArrayView haystack_00;
  QByteArrayView needle;
  QByteArrayView needle_00;
  QMultiMap<QByteArray,_int> automaticPropertyMetaTypes;
  QMap<int,_QMultiMap<QByteArray,_int>_> methodsWithAutomaticTypes;
  long local_b0;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  local_90;
  undefined1 local_88 [56];
  undefined1 local_50 [16];
  QByteArray *local_40;
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  pcVar27 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar27 == (char *)0x0) {
    pcVar27 = "";
  }
  bVar11 = false;
  bVar10 = false;
  bVar15 = false;
  fprintf((FILE *)this->out,
          "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
          pcVar27);
  pcVar27 = (this->cdef->super_BaseDef).classname.d.ptr;
  if (pcVar27 == (char *)0x0) {
    pcVar27 = "";
  }
  pcVar32 = "    auto *_t = reinterpret_cast<%s *>(_o);\n";
  if (this->cdef->hasQObject != false) {
    pcVar32 = "    auto *_t = static_cast<%s *>(_o);\n";
  }
  fprintf((FILE *)this->out,pcVar32,pcVar27);
  pCVar22 = this->cdef;
  if ((pCVar22->constructorList).d.size != 0) {
    fwrite("    if (_c == QMetaObject::CreateInstance) {\n",0x2d,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    uVar17 = (uint)(this->cdef->constructorList).d.size;
    if ((int)uVar17 < 1) {
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
      fwrite("    if (_c == QMetaObject::ConstructInPlace) {\n",0x2f,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    }
    else {
      uVar38 = 0;
      do {
        pcVar27 = (this->cdef->super_BaseDef).classname.d.ptr;
        if (pcVar27 == (char *)0x0) {
          pcVar27 = "";
        }
        fprintf((FILE *)this->out,"        case %d: { %s *_r = new %s(",uVar38 & 0xffffffff,pcVar27,
                pcVar27);
        pFVar2 = (this->cdef->constructorList).d.ptr;
        lVar29 = pFVar2[uVar38].arguments.d.size;
        if (lVar29 != 0) {
          pAVar35 = pFVar2[uVar38].arguments.d.ptr;
          pAVar42 = pAVar35 + lVar29;
          lVar29 = 0;
          uVar37 = 1;
          do {
            if (lVar29 != 0) {
              fputc(0x2c,(FILE *)this->out);
            }
            pcVar27 = (pAVar35->typeNameForCast).d.ptr;
            if (pcVar27 == (char *)0x0) {
              pcVar27 = "";
            }
            fprintf((FILE *)this->out,"(*reinterpret_cast<%s>(_a[%d]))",pcVar27,(ulong)uVar37);
            pAVar35 = pAVar35 + 1;
            lVar29 = lVar29 + -0xa8;
            uVar37 = uVar37 + 1;
          } while (pAVar35 != pAVar42);
        }
        fwrite(");\n",3,1,(FILE *)this->out);
        pcVar27 = anon_var_dwarf_3f085;
        if ((this->cdef->hasQGadget == false) &&
           (pcVar27 = "QObject", this->cdef->hasQNamespace != false)) {
          pcVar27 = anon_var_dwarf_3f085;
        }
        fprintf((FILE *)this->out,
                "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",pcVar27);
        uVar38 = uVar38 + 1;
      } while (uVar38 != (uVar17 & 0x7fffffff));
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
      fwrite("    if (_c == QMetaObject::ConstructInPlace) {\n",0x2f,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      if (0 < (int)uVar17) {
        uVar38 = 0;
        do {
          pcVar27 = (this->cdef->super_BaseDef).classname.d.ptr;
          if (pcVar27 == (char *)0x0) {
            pcVar27 = "";
          }
          fprintf((FILE *)this->out,"        case %d: { new (_a[0]) %s(",uVar38 & 0xffffffff,pcVar27
                 );
          pFVar2 = (this->cdef->constructorList).d.ptr;
          lVar29 = pFVar2[uVar38].arguments.d.size;
          if (lVar29 != 0) {
            pAVar35 = pFVar2[uVar38].arguments.d.ptr;
            pAVar42 = pAVar35 + lVar29;
            lVar29 = 0;
            uVar31 = 1;
            do {
              if (lVar29 != 0) {
                fputc(0x2c,(FILE *)this->out);
              }
              pcVar27 = (pAVar35->typeNameForCast).d.ptr;
              if (pcVar27 == (char *)0x0) {
                pcVar27 = "";
              }
              fprintf((FILE *)this->out,"(*reinterpret_cast<%s>(_a[%d]))",pcVar27,uVar31);
              pAVar35 = pAVar35 + 1;
              lVar29 = lVar29 + -0xa8;
              uVar31 = (ulong)((int)uVar31 + 1);
            } while (pAVar35 != pAVar42);
          }
          fwrite("); } break;\n",0xc,1,(FILE *)this->out);
          uVar38 = uVar38 + 1;
        } while (uVar38 != (uVar17 & 0x7fffffff));
      }
    }
    fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    pCVar22 = this->cdef;
    bVar11 = true;
    bVar10 = true;
    bVar15 = true;
  }
  bVar9 = false;
  this_00 = (QCommonArrayOps<FunctionDef> *)(local_88 + 0x20);
  local_88._32_8_ = (uint *)0x0;
  local_88._40_8_ = (Data *)0x0;
  local_88._48_8_ = (QByteArray *)0x0;
  pFVar2 = (pCVar22->signalList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (pCVar22->signalList).d.size);
  pFVar2 = (this->cdef->slotList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->slotList).d.size);
  pFVar2 = (this->cdef->methodList).d.ptr;
  QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
            (this_00,pFVar2,pFVar2 + (this->cdef->methodList).d.size);
  if ((QByteArray *)local_88._48_8_ != (QByteArray *)0x0) {
    fwrite("    if (_c == QMetaObject::InvokeMetaMethod) {\n",0x2f,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    if ((QByteArray *)local_88._48_8_ != (QByteArray *)0x0) {
      pQVar28 = (QByteArray *)0x0;
      do {
        uVar12 = local_88._40_8_;
        fprintf((FILE *)this->out,"        case %d: ");
        lhs = &(((Data *)(uVar12 + ((long)pQVar28 * 0xd + 5) * 0x10))->super_QArrayData).alloc;
        local_88._0_8_ = anon_var_dwarf_3f085;
        bVar15 = operator!=((QByteArray *)lhs,(char **)local_88);
        if (bVar15) {
          pFVar26 = (FILE *)this->out;
          pCVar22 = *(ClassDef **)
                     &((Data *)(uVar12 + ((long)pQVar28 * 0xd + 6) * 0x10))->super_QArrayData;
          pCVar3 = (ClassDef *)
                   (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 6) * 0x10))->super_QArrayData).alloc;
          if ((pCVar3 == (ClassDef *)0x0) ||
             ((&pCVar22[-1].requireCompleteMethodTypes)[(long)pCVar3] != true)) {
            local_88._0_8_ = *lhs;
            local_88._8_8_ = pCVar22;
            local_88._16_8_ = pCVar3;
            if ((Moc *)local_88._0_8_ != (Moc *)0x0) {
              LOCK();
              *(int *)&(((Parser *)
                        &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                           *)local_88._0_8_)->super_QSharedData)->symbols).d.d =
                   *(int *)&(((Parser *)
                             &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                                *)local_88._0_8_)->super_QSharedData)->symbols).d.d + 1;
              UNLOCK();
            }
          }
          else {
            haystack.m_data = (storage_type *)pCVar22;
            haystack.m_size = (qsizetype)pCVar3;
            needle.m_data = "&&";
            needle.m_size = 2;
            bVar15 = QtPrivate::endsWith(haystack,needle);
            if (bVar15) {
              pbVar43 = &pCVar3[-1].hasQNamespace;
            }
            else {
              pbVar43 = &pCVar3[-1].requireCompleteMethodTypes;
            }
            QByteArray::left((QByteArray *)local_88,(QByteArray *)lhs,(qsizetype)pbVar43);
          }
          pcVar27 = (char *)local_88._8_8_;
          if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
            pcVar27 = "";
          }
          fprintf(pFVar26,"{ %s _r = ",pcVar27);
          if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)local_88._0_8_ !=
              (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
            }
          }
        }
        fwrite("_t->",4,1,(FILE *)this->out);
        lVar29._0_4_ = (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 0xb) * 0x10))->super_QArrayData).
                       ref_;
        lVar29._4_4_ = (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 0xb) * 0x10))->super_QArrayData).
                       flags;
        if (lVar29 != 0) {
          pcVar27 = (char *)(((Data *)(uVar12 + ((long)pQVar28 * 0xd + 10) * 0x10))->
                            super_QArrayData).alloc;
          if (pcVar27 == (char *)0x0) {
            pcVar27 = "";
          }
          fprintf((FILE *)this->out,"%s->",pcVar27);
        }
        pcVar27 = *(char **)&((Data *)(uVar12 + ((long)pQVar28 * 0xd + 9) * 0x10))->super_QArrayData
        ;
        if (pcVar27 == (char *)0x0) {
          pcVar27 = "";
        }
        fprintf((FILE *)this->out,"%s(",pcVar27);
        if (*(undefined1 *)
             ((long)&(((Data *)(uVar12 + ((long)pQVar28 * 0xd + 0xc) * 0x10))->super_QArrayData).
                     alloc + 7) == '\x01') {
          fwrite("QMethodRawArguments{ _a }",0x19,1,(FILE *)this->out);
          bVar11 = true;
        }
        else {
          if (*(long *)&((Data *)(uVar12 + ((long)pQVar28 * 0xd + 5) * 0x10))->super_QArrayData != 0
             ) {
            lVar29 = (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 4) * 0x10))->super_QArrayData).alloc
            ;
            lVar40 = lVar29 + *(long *)&((Data *)(uVar12 + ((long)pQVar28 * 0xd + 5) * 0x10))->
                                        super_QArrayData * 0xa8;
            lVar36 = 0;
            uVar17 = 1;
            do {
              if (lVar36 != 0) {
                fputc(0x2c,(FILE *)this->out);
              }
              pcVar27 = *(char **)(lVar29 + 0x90);
              if (pcVar27 == (char *)0x0) {
                pcVar27 = "";
              }
              fprintf((FILE *)this->out,"(*reinterpret_cast< %s>(_a[%d]))",pcVar27,(ulong)uVar17);
              lVar29 = lVar29 + 0xa8;
              lVar36 = lVar36 + -0xa8;
              uVar17 = uVar17 + 1;
            } while (lVar29 != lVar40);
            bVar11 = true;
          }
          if (*(undefined1 *)
               ((long)&(((Data *)(uVar12 + ((long)pQVar28 * 0xd + 0xc) * 0x10))->super_QArrayData).
                       alloc + 3) != '\0') {
            lVar40._0_4_ = (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 5) * 0x10))->super_QArrayData)
                           .ref_;
            lVar40._4_4_ = (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 5) * 0x10))->super_QArrayData)
                           .flags;
            if (lVar40 != 0) {
              fwrite(", ",2,1,(FILE *)this->out);
            }
            fputs("QPrivateSignal()",(FILE *)this->out);
          }
        }
        fwrite(");",2,1,(FILE *)this->out);
        local_88._0_8_ = anon_var_dwarf_3f085;
        bVar15 = operator!=((QByteArray *)lhs,(char **)local_88);
        if (bVar15) {
          pFVar26 = (FILE *)this->out;
          pCVar22 = *(ClassDef **)
                     &((Data *)(uVar12 + ((long)pQVar28 * 0xd + 6) * 0x10))->super_QArrayData;
          pCVar3 = (ClassDef *)
                   (((Data *)(uVar12 + ((long)pQVar28 * 0xd + 6) * 0x10))->super_QArrayData).alloc;
          if ((pCVar3 == (ClassDef *)0x0) ||
             ((&pCVar22[-1].requireCompleteMethodTypes)[(long)pCVar3] != true)) {
            local_88._0_8_ = *lhs;
            local_88._8_8_ = pCVar22;
            local_88._16_8_ = pCVar3;
            if ((Moc *)local_88._0_8_ != (Moc *)0x0) {
              LOCK();
              *(int *)&(((Parser *)
                        &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                           *)local_88._0_8_)->super_QSharedData)->symbols).d.d =
                   *(int *)&(((Parser *)
                             &((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                                *)local_88._0_8_)->super_QSharedData)->symbols).d.d + 1;
              UNLOCK();
            }
          }
          else {
            haystack_00.m_data = (storage_type *)pCVar22;
            haystack_00.m_size = (qsizetype)pCVar3;
            needle_00.m_data = "&&";
            needle_00.m_size = 2;
            bVar15 = QtPrivate::endsWith(haystack_00,needle_00);
            if (bVar15) {
              pbVar43 = &pCVar3[-1].hasQNamespace;
            }
            else {
              pbVar43 = &pCVar3[-1].requireCompleteMethodTypes;
            }
            QByteArray::left((QByteArray *)local_88,(QByteArray *)lhs,(qsizetype)pbVar43);
          }
          pcVar27 = (char *)local_88._8_8_;
          if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
            pcVar27 = "";
          }
          fprintf(pFVar26,
                  "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                  pcVar27);
          if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)local_88._0_8_ !=
              (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
               *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
            }
          }
          bVar11 = true;
        }
        fwrite(" break;\n",8,1,(FILE *)this->out);
        pQVar28 = (QByteArray *)
                  ((long)&(((QBasicAtomicInt *)&(pQVar28->d).d)->_q_value).super___atomic_base<int>.
                          _M_i + 1);
      } while (pQVar28 < (ulong)local_88._48_8_);
    }
    fwrite("        default: ;\n",0x13,1,(FILE *)this->out);
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    methodsWithAutomaticTypesHelper((Generator *)local_88,(QList<FunctionDef> *)this);
    if (((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
          *)local_88._0_8_ !=
         (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
          *)0x0) &&
       (lVar36._0_4_ = ((QArrayData *)(local_88._0_8_ + 0x30))->ref_,
       lVar36._4_4_ = ((QArrayData *)(local_88._0_8_ + 0x30))->flags, lVar36 != 0)) {
      fwrite("    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n",0x3d,1,
             (FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      fwrite("        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n",0x4d,1
             ,(FILE *)this->out);
      if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)local_88._0_8_ ==
          (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)0x0) {
        p_Var19 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var19 = *(_Rb_tree_node_base **)(local_88._0_8_ + 0x20);
      }
      p_Var24 = (_Rb_tree_node_base *)(local_88._0_8_ + 0x10);
      if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)local_88._0_8_ ==
          (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
           *)0x0) {
        p_Var24 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var19 != p_Var24; p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        fprintf((FILE *)this->out,"        case %d:\n",(ulong)p_Var19[1]._M_color);
        fwrite("            switch (*reinterpret_cast<int*>(_a[1])) {\n",0x36,1,(FILE *)this->out);
        fwrite("            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n",
               0x51,1,(FILE *)this->out);
        p_Var4 = p_Var19[1]._M_parent;
        if (p_Var4 == (_Base_ptr)0x0) {
          p_Var18 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var18 = *(_Rb_tree_node_base **)(p_Var4 + 1);
        }
        p_Var39 = (_Rb_tree_node_base *)&p_Var4->_M_left;
        if (p_Var4 == (_Base_ptr)0x0) {
          p_Var39 = (_Rb_tree_node_base *)0x0;
        }
        while (p_Var8 = p_Var18, p_Var8 != p_Var39) {
          fprintf((FILE *)this->out,"            case %d:\n",(ulong)*(uint *)&p_Var8[1]._M_right);
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          if ((p_Var18 == p_Var39) ||
             (bVar15 = operator!=((QByteArray *)(p_Var18 + 1),(QByteArray *)(p_Var8 + 1)), bVar15))
          {
            pcVar27 = (char *)p_Var8[1]._M_parent;
            if ((_Base_ptr)pcVar27 == (_Base_ptr)0x0) {
              pcVar27 = "";
            }
            fprintf((FILE *)this->out,
                    "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n"
                    ,pcVar27);
          }
        }
        fwrite("            }\n",0xe,1,(FILE *)this->out);
        fwrite("            break;\n",0x13,1,(FILE *)this->out);
      }
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
      bVar11 = true;
    }
    bVar10 = true;
    bVar15 = true;
    bVar9 = true;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)local_88);
  }
  if ((this->cdef->signalList).d.size != 0) {
    fwrite("    if (_c == QMetaObject::IndexOfMethod) {\n",0x2c,1,(FILE *)this->out);
    pCVar22 = this->cdef;
    if (0 < (int)(pCVar22->signalList).d.size) {
      lVar29 = 0;
      do {
        pFVar2 = (pCVar22->signalList).d.ptr;
        if (((pFVar2[lVar29].wasCloned == false) && (pFVar2[lVar29].inPrivateClass.d.size == 0)) &&
           (pFVar2[lVar29].isStatic == false)) {
          pcVar27 = pFVar2[lVar29].type.rawName.d.ptr;
          if (pcVar27 == (char *)0x0) {
            pcVar27 = "";
          }
          pcVar32 = (pCVar22->super_BaseDef).classname.d.ptr;
          if (pcVar32 == (char *)0x0) {
            pcVar32 = "";
          }
          fprintf((FILE *)this->out,"        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",pcVar27,
                  pcVar32);
          lVar40 = pFVar2[lVar29].arguments.d.size;
          if (lVar40 != 0) {
            pAVar35 = pFVar2[lVar29].arguments.d.ptr;
            pAVar42 = pAVar35 + lVar40;
            lVar40 = 0;
            do {
              if (lVar40 != 0) {
                fwrite(", ",2,1,(FILE *)this->out);
              }
              pFVar26 = (FILE *)this->out;
              local_40 = &pAVar35->rightType;
              local_50[8] = 0x20;
              local_50._0_8_ = pAVar35;
              QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>::
              convertTo<QByteArray>
                        ((QByteArray *)local_88,
                         (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>
                          *)local_50);
              pcVar27 = (char *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pcVar27 = "";
              }
              fputs(pcVar27,pFVar26);
              if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                   *)local_88._0_8_ !=
                  (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                   *)0x0) {
                LOCK();
                *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
                UNLOCK();
                if (*(int *)local_88._0_8_ == 0) {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
                }
              }
              pAVar35 = pAVar35 + 1;
              lVar40 = lVar40 + -0xa8;
            } while (pAVar35 != pAVar42);
          }
          if (pFVar2[lVar29].isPrivateSignal != false) {
            if (pFVar2[lVar29].arguments.d.size != 0) {
              fwrite(", ",2,1,(FILE *)this->out);
            }
            fputs("QPrivateSignal",(FILE *)this->out);
          }
          pcVar27 = "";
          if (pFVar2[lVar29].isConst != false) {
            pcVar27 = " const";
          }
          pcVar32 = (this->cdef->super_BaseDef).classname.d.ptr;
          if (pcVar32 == (char *)0x0) {
            pcVar32 = "";
          }
          pcVar34 = pFVar2[lVar29].name.d.ptr;
          if (pcVar34 == (char *)0x0) {
            pcVar34 = "";
          }
          fprintf((FILE *)this->out,")%s>(_a, &%s::%s, %d))\n",pcVar27,pcVar32,pcVar34);
          fwrite("            return;\n",0x14,1,(FILE *)this->out);
          pCVar22 = this->cdef;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < (int)(pCVar22->signalList).d.size);
    }
    bVar11 = true;
    bVar15 = true;
    fwrite("    }\n",6,1,(FILE *)this->out);
  }
  local_90.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
        )&DAT_aaaaaaaaaaaaaaaa;
  automaticPropertyMetaTypesHelper((Generator *)&local_90);
  if ((local_90.d.ptr !=
       (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
        *)0x0) && (*(IncludePath **)((long)local_90.d.ptr + 0x30) != (IncludePath *)0x0)) {
    fwrite("    if (_c == QMetaObject::RegisterPropertyMetaType) {\n",0x37,1,(FILE *)this->out);
    fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
    fwrite("        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n",0x3d,1,(FILE *)this->out
          );
    if (local_90.d.ptr ==
        (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
         *)0x0) {
      p_Var19 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var19 = *(_Base_ptr *)((long)local_90.d.ptr + 0x20);
    }
    p_Var24 = (_Rb_tree_node_base *)((long)local_90.d.ptr + 0x10);
    if (local_90.d.ptr ==
        (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
         *)0x0) {
      p_Var24 = (_Rb_tree_node_base *)0x0;
    }
    while (p_Var18 = p_Var19, p_Var18 != p_Var24) {
      fprintf((FILE *)this->out,"        case %d:\n",(ulong)*(uint *)&p_Var18[1]._M_right);
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      if ((p_Var19 == p_Var24) ||
         (bVar15 = operator!=((QByteArray *)(p_Var19 + 1),(QByteArray *)(p_Var18 + 1)), bVar15)) {
        pcVar27 = (char *)p_Var18[1]._M_parent;
        if ((_Base_ptr)pcVar27 == (_Base_ptr)0x0) {
          pcVar27 = "";
        }
        fprintf((FILE *)this->out,
                "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n",
                pcVar27);
      }
    }
    fwrite("        }\n",10,1,(FILE *)this->out);
    fwrite("    }\n",6,1,(FILE *)this->out);
    bVar11 = true;
    bVar10 = true;
    bVar15 = true;
  }
  lVar29 = (this->cdef->propertyList).d.size;
  if (lVar29 != 0) {
    pPVar5 = (this->cdef->propertyList).d.ptr;
    lVar40 = 0;
    bVar7 = false;
    bVar30 = 0;
    bVar41 = false;
    bVar16 = false;
    bVar13 = false;
    do {
      bVar14 = bVar13;
      bVar13 = true;
      if ((*(long *)((long)&(pPVar5->read).d.size + lVar40) != 0) ||
         (lVar36 = *(long *)((long)&(pPVar5->member).d.size + lVar40),
         bVar16 = (bool)(bVar16 | lVar36 != 0), bVar13 = bVar16, lVar36 != 0)) {
        bVar16 = bVar13;
        bVar41 = (bool)(bVar41 | *(int *)((long)&pPVar5->gspec + lVar40) - 3U < 0xfffffffe);
      }
      bVar33 = 1;
      if (*(long *)((long)&(pPVar5->write).d.size + lVar40) == 0) {
        if (*(long *)((long)&(pPVar5->member).d.size + lVar40) == 0) {
          bVar33 = 0;
        }
        else {
          bVar33 = (&pPVar5->constant)[lVar40] ^ 1;
        }
      }
      bVar30 = bVar30 & 1 | bVar33;
      bVar44 = *(long *)((long)&(pPVar5->reset).d.size + lVar40) != 0;
      bVar13 = (bool)(bVar14 | bVar44);
      bVar7 = (bool)(bVar7 | *(long *)((long)&(pPVar5->bind).d.size + lVar40) != 0);
      lVar40 = lVar40 + 0x158;
    } while (lVar29 * 0x158 - lVar40 != 0);
    bVar23 = (bool)(bVar30 != 0 | bVar16);
    if (bVar14 || bVar44) {
      bVar9 = true;
      bVar15 = true;
      bVar10 = true;
    }
    if (bVar23 || bVar7) {
      bVar9 = true;
      bVar15 = true;
      bVar10 = true;
    }
    bVar14 = true;
    if (!bVar23 && !bVar7) {
      bVar14 = bVar11;
    }
    bVar11 = bVar14;
    if (bVar16) {
      fwrite("    if (_c == QMetaObject::ReadProperty) {\n",0x2b,1,(FILE *)this->out);
      if (bVar41) {
        fwrite("        void *_v = _a[0];\n",0x1a,1,(FILE *)this->out);
      }
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar22 = this->cdef;
      if (0 < (int)(pCVar22->propertyList).d.size) {
        lVar29 = 0x120;
        local_b0 = 0;
        do {
          pPVar5 = (pCVar22->propertyList).d.ptr;
          if ((*(long *)((long)pPVar5 + lVar29 + -200) != 0) ||
             (*(long *)((long)pPVar5 + lVar29 + -0xe0) != 0)) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar5->name).d.size + lVar29) != 0) {
              local_50._0_8_ = (long)&(pPVar5->name).d.d + lVar29;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            iVar1 = *(int *)((long)&(pPVar5->type).d.d + lVar29 + 4);
            pcVar27 = (char *)local_88._8_8_;
            if (iVar1 == 1) {
              pFVar26 = (FILE *)this->out;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pcVar27 = "";
              }
              pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xd0);
              if (pcVar32 == (char *)0x0) {
                pcVar32 = "";
              }
              pcVar34 = 
              "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n"
              ;
LAB_0010cceb:
              fprintf(pFVar26,pcVar34,local_b0,pcVar27,pcVar32);
            }
            else {
              if (iVar1 == 2) {
                pFVar26 = (FILE *)this->out;
                if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                  pcVar27 = "";
                }
                pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xd0);
                if (pcVar32 == (char *)0x0) {
                  pcVar32 = "";
                }
                pcVar34 = 
                "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n"
                ;
                goto LAB_0010cceb;
              }
              pCVar22 = this->cdef;
              local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
              pQVar6 = (pCVar22->super_BaseDef).enumDeclarations.d.d.ptr;
              if (pQVar6 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                             *)0x0) {
LAB_0010cd8e:
                local_50._0_8_ = "default";
                bVar16 = operator==((QByteArray *)((long)pPVar5 + lVar29 + -0xd8),(char **)local_50)
                ;
                pcVar27 = (char *)local_88._8_8_;
                if (bVar16) {
                  uVar17 = *(uint *)((long)&(pPVar5->type).d.ptr + lVar29 + 4);
                  if ((uVar17 & 4) == 0) {
                    pcVar32 = "class ";
                    if (((uVar17 & 2) == 0) && (pcVar32 = "", (uVar17 & 1) != 0)) {
                      pcVar32 = "struct ";
                    }
                  }
                  else {
                    pcVar32 = "enum class ";
                    if (((uVar17 & 2) == 0) && (pcVar32 = "enum ", (uVar17 & 1) != 0)) {
                      pcVar32 = "enum struct ";
                    }
                  }
                  pFVar26 = (FILE *)this->out;
                  pcVar34 = *(char **)((long)pPVar5 + lVar29 + -0x100);
                  if ((ClassDef *)pcVar34 == (ClassDef *)0x0) {
                    pcVar34 = "";
                  }
                  if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                    pcVar27 = "";
                  }
                  pcVar21 = 
                  "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n";
                }
                else {
                  pFVar26 = (FILE *)this->out;
                  uVar17 = *(uint *)((long)&(pPVar5->type).d.ptr + lVar29 + 4);
                  if (*(long *)((long)pPVar5 + lVar29 + -200) == 0) {
                    if ((uVar17 & 4) == 0) {
                      pcVar32 = "class ";
                      if (((uVar17 & 2) == 0) && (pcVar32 = "", (uVar17 & 1) != 0)) {
                        pcVar32 = "struct ";
                      }
                    }
                    else {
                      pcVar32 = "enum class ";
                      if (((uVar17 & 2) == 0) && (pcVar32 = "enum ", (uVar17 & 1) != 0)) {
                        pcVar32 = "enum struct ";
                      }
                    }
                    pcVar34 = *(char **)((long)pPVar5 + lVar29 + -0x100);
                    if ((ClassDef *)pcVar34 == (ClassDef *)0x0) {
                      pcVar34 = "";
                    }
                    if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                      pcVar27 = "";
                    }
                    pcVar21 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n";
                  }
                  else {
                    if ((uVar17 & 4) == 0) {
                      pcVar32 = "class ";
                      if (((uVar17 & 2) == 0) && (pcVar32 = "", (uVar17 & 1) != 0)) {
                        pcVar32 = "struct ";
                      }
                    }
                    else {
                      pcVar32 = "enum class ";
                      if (((uVar17 & 2) == 0) && (pcVar32 = "enum ", (uVar17 & 1) != 0)) {
                        pcVar32 = "enum struct ";
                      }
                    }
                    pcVar34 = *(char **)((long)pPVar5 + lVar29 + -0x100);
                    if ((ClassDef *)pcVar34 == (ClassDef *)0x0) {
                      pcVar34 = "";
                    }
                    if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                      pcVar27 = "";
                    }
                    pcVar21 = "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n";
                  }
                }
              }
              else {
                cVar20 = std::
                         _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                         ::find(&(pQVar6->m)._M_t,(key_type *)((long)pPVar5 + lVar29 + -0x108));
                pp_Var25 = (_Base_ptr *)local_50;
                if ((_Rb_tree_header *)cVar20._M_node !=
                    &(((pCVar22->super_BaseDef).enumDeclarations.d.d.ptr)->m)._M_t._M_impl.
                     super__Rb_tree_header) {
                  pp_Var25 = &cVar20._M_node[1]._M_right;
                }
                if (((ulong)*pp_Var25 & 1) == 0) goto LAB_0010cd8e;
                pFVar26 = (FILE *)this->out;
                pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0x100);
                if (pcVar32 == (char *)0x0) {
                  pcVar32 = "";
                }
                pcVar34 = (char *)local_88._8_8_;
                if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                  pcVar34 = "";
                }
                pcVar27 = *(char **)((long)pPVar5 + lVar29 + -0xd0);
                if ((ClassDef *)pcVar27 == (ClassDef *)0x0) {
                  pcVar27 = "";
                }
                pcVar21 = "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n";
              }
              fprintf(pFVar26,pcVar21,local_b0,pcVar32,pcVar34,pcVar27);
            }
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
            pCVar22 = this->cdef;
          }
          local_b0 = local_b0 + 1;
          lVar29 = lVar29 + 0x158;
        } while (local_b0 < (int)(pCVar22->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar30 != 0) {
      fwrite("    if (_c == QMetaObject::WriteProperty) {\n",0x2c,1,(FILE *)this->out);
      fwrite("        void *_v = _a[0];\n",0x1a,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar22 = this->cdef;
      if (0 < (int)(pCVar22->propertyList).d.size) {
        lVar29 = 0x120;
        uVar38 = 0;
        do {
          pPVar5 = (pCVar22->propertyList).d.ptr;
          if ((*(char *)((long)&(pPVar5->type).d.size + lVar29) == '\0') &&
             ((*(long *)((long)pPVar5 + lVar29 + -0xb0) != 0 ||
              (*(long *)((long)pPVar5 + lVar29 + -0xe0) != 0)))) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar5->name).d.size + lVar29) != 0) {
              local_50._0_8_ = (long)&(pPVar5->name).d.d + lVar29;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            local_50._0_8_ = "default";
            bVar16 = operator==((QByteArray *)((long)pPVar5 + lVar29 + -0xc0),(char **)local_50);
            if (bVar16) {
              fprintf((FILE *)this->out,"        case %d: {\n",uVar38 & 0xffffffff);
              pcVar27 = (char *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pcVar27 = "";
              }
              pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xa0);
              if (pcVar32 == (char *)0x0) {
                pcVar32 = "";
              }
              uVar17 = *(uint *)((long)&(pPVar5->type).d.ptr + lVar29 + 4);
              if ((uVar17 & 4) == 0) {
                pcVar34 = "class ";
                if ((uVar17 & 2) == 0) {
                  pcVar34 = "struct ";
                  pcVar21 = "";
LAB_0010d238:
                  if ((uVar17 & 1) == 0) {
                    pcVar34 = pcVar21;
                  }
                }
              }
              else {
                pcVar34 = "enum class ";
                if ((uVar17 & 2) == 0) {
                  pcVar34 = "enum struct ";
                  pcVar21 = "enum ";
                  goto LAB_0010d238;
                }
              }
              pcVar21 = *(char **)((long)pPVar5 + lVar29 + -0x100);
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              fprintf((FILE *)this->out,
                      "            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",pcVar27,pcVar32
                      ,pcVar34,pcVar21);
              fwrite("            break;\n",0x13,1,(FILE *)this->out);
              pFVar26 = (FILE *)this->out;
              __size = 10;
              pcVar27 = "        }\n";
LAB_0010d291:
              fwrite(pcVar27,__size,1,pFVar26);
            }
            else if (*(long *)((long)pPVar5 + lVar29 + -0xb0) == 0) {
              fprintf((FILE *)this->out,"        case %d:",uVar38 & 0xffffffff);
              pcVar27 = (char *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pcVar27 = "";
              }
              pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xe8);
              if (pcVar32 == (char *)0x0) {
                pcVar32 = "";
              }
              uVar17 = *(uint *)((long)&(pPVar5->type).d.ptr + lVar29 + 4);
              if (*(long *)((long)pPVar5 + lVar29 + -8) != 0) {
                if ((uVar17 & 4) == 0) {
                  pcVar34 = "class ";
                  if ((uVar17 & 2) == 0) {
                    pcVar34 = "struct ";
                    pcVar21 = "";
LAB_0010d3ed:
                    if ((uVar17 & 1) == 0) {
                      pcVar34 = pcVar21;
                    }
                  }
                }
                else {
                  pcVar34 = "enum class ";
                  if ((uVar17 & 2) == 0) {
                    pcVar34 = "enum struct ";
                    pcVar21 = "enum ";
                    goto LAB_0010d3ed;
                  }
                }
                pcVar21 = *(char **)((long)pPVar5 + lVar29 + -0x100);
                if (pcVar21 == (char *)0x0) {
                  pcVar21 = "";
                }
                fprintf((FILE *)this->out,
                        "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n"
                        ,pcVar27,pcVar32,pcVar34,pcVar21);
                pcVar27 = *(char **)((long)pPVar5 + lVar29 + -0x10);
                if (pcVar27 == (char *)0x0) {
                  pcVar27 = "";
                }
                fprintf((FILE *)this->out,"                Q_EMIT _t->%s(",pcVar27);
                lVar40 = (long)*(int *)((long)&(pPVar5->type).d.d + lVar29);
                if (((-1 < lVar40) &&
                    (pFVar2 = (this->cdef->signalList).d.ptr, pFVar2[lVar40].arguments.d.size == 1))
                   && (bVar16 = operator==(&(pFVar2[lVar40].arguments.d.ptr)->normalizedType,
                                           (QByteArray *)((long)pPVar5 + lVar29 + -0x108)), bVar16))
                {
                  pcVar27 = (char *)local_88._8_8_;
                  if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                    pcVar27 = "";
                  }
                  pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xe8);
                  if (pcVar32 == (char *)0x0) {
                    pcVar32 = "";
                  }
                  fprintf((FILE *)this->out,"%s%s",pcVar27,pcVar32);
                }
                fwrite(");\n",3,1,(FILE *)this->out);
                pFVar26 = (FILE *)this->out;
                __size = 0x13;
                pcVar27 = "            break;\n";
                goto LAB_0010d291;
              }
              if ((uVar17 & 4) == 0) {
                pcVar34 = "class ";
                if ((uVar17 & 2) == 0) {
                  pcVar34 = "struct ";
                  pcVar21 = "";
LAB_0010d4fd:
                  if ((uVar17 & 1) == 0) {
                    pcVar34 = pcVar21;
                  }
                }
              }
              else {
                pcVar34 = "enum class ";
                if ((uVar17 & 2) == 0) {
                  pcVar34 = "enum struct ";
                  pcVar21 = "enum ";
                  goto LAB_0010d4fd;
                }
              }
              pcVar21 = *(char **)((long)pPVar5 + lVar29 + -0x100);
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              fprintf((FILE *)this->out,
                      " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                      pcVar27,pcVar32,pcVar34,pcVar21);
            }
            else {
              pcVar27 = (char *)local_88._8_8_;
              if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
                pcVar27 = "";
              }
              pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xb8);
              if (pcVar32 == (char *)0x0) {
                pcVar32 = "";
              }
              uVar17 = *(uint *)((long)&(pPVar5->type).d.ptr + lVar29 + 4);
              if ((uVar17 & 4) == 0) {
                pcVar34 = "class ";
                if ((uVar17 & 2) == 0) {
                  pcVar34 = "struct ";
                  pcVar21 = "";
LAB_0010d329:
                  if ((uVar17 & 1) == 0) {
                    pcVar34 = pcVar21;
                  }
                }
              }
              else {
                pcVar34 = "enum class ";
                if ((uVar17 & 2) == 0) {
                  pcVar34 = "enum struct ";
                  pcVar21 = "enum ";
                  goto LAB_0010d329;
                }
              }
              pcVar21 = *(char **)((long)pPVar5 + lVar29 + -0x100);
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              fprintf((FILE *)this->out,
                      "        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                      uVar38 & 0xffffffff,pcVar27,pcVar32,pcVar34,pcVar21);
            }
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
            pCVar22 = this->cdef;
          }
          uVar38 = uVar38 + 1;
          lVar29 = lVar29 + 0x158;
        } while ((long)uVar38 < (long)(int)(pCVar22->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar13) {
      fwrite("if (_c == QMetaObject::ResetProperty) {\n",0x28,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar22 = this->cdef;
      if (0 < (int)(pCVar22->propertyList).d.size) {
        lVar29 = 0x98;
        uVar38 = 0;
        do {
          pPVar5 = (pCVar22->propertyList).d.ptr;
          if (*(long *)((long)&(pPVar5->name).d.ptr + lVar29) != 0) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar5->reset).d.ptr + lVar29) != 0) {
              local_50._0_8_ = (long)&(pPVar5->bind).d.size + lVar29;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            pcVar27 = (char *)local_88._8_8_;
            if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
              pcVar27 = "";
            }
            pcVar32 = *(char **)((long)&(pPVar5->name).d.d + lVar29);
            if (pcVar32 == (char *)0x0) {
              pcVar32 = "";
            }
            fprintf((FILE *)this->out,"        case %d: %s%s(); break;\n",uVar38 & 0xffffffff,
                    pcVar27,pcVar32);
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
            pCVar22 = this->cdef;
          }
          uVar38 = uVar38 + 1;
          lVar29 = lVar29 + 0x158;
        } while ((long)uVar38 < (long)(int)(pCVar22->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
    if (bVar7) {
      fwrite("    if (_c == QMetaObject::BindableProperty) {\n",0x2f,1,(FILE *)this->out);
      fwrite("        switch (_id) {\n",0x17,1,(FILE *)this->out);
      pCVar22 = this->cdef;
      if (0 < (int)(pCVar22->propertyList).d.size) {
        lVar29 = 0x120;
        uVar38 = 0;
        do {
          pPVar5 = (pCVar22->propertyList).d.ptr;
          if (*(long *)((long)pPVar5 + lVar29 + -0x98) != 0) {
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray((QByteArray *)local_88,"_t->",-1);
            if (*(long *)((long)&(pPVar5->name).d.size + lVar29) != 0) {
              local_50._0_8_ = (long)&(pPVar5->name).d.d + lVar29;
              local_50._8_8_ = "->";
              QtStringBuilder::appendToByteArray<QByteArray_const&,char_const(&)[3]>
                        ((QByteArray *)local_88,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)local_50,'\0');
            }
            pcVar27 = (char *)local_88._8_8_;
            if ((ClassDef *)local_88._8_8_ == (ClassDef *)0x0) {
              pcVar27 = "";
            }
            pcVar32 = *(char **)((long)pPVar5 + lVar29 + -0xa0);
            if (pcVar32 == (char *)0x0) {
              pcVar32 = "";
            }
            fprintf((FILE *)this->out,
                    "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); break;\n",
                    uVar38 & 0xffffffff,pcVar27,pcVar32);
            if ((QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)local_88._0_8_ !=
                (QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>
                 *)0x0) {
              LOCK();
              *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_88._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
            pCVar22 = this->cdef;
          }
          uVar38 = uVar38 + 1;
          lVar29 = lVar29 + 0x158;
        } while ((long)uVar38 < (long)(int)(pCVar22->propertyList).d.size);
      }
      fwrite("        default: break;\n",0x18,1,(FILE *)this->out);
      fwrite("        }\n",10,1,(FILE *)this->out);
      fwrite("    }\n",6,1,(FILE *)this->out);
    }
  }
  if (!bVar9) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_t");
  }
  if (!bVar15) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_c");
  }
  if (!bVar10) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_id");
  }
  if (!bVar11) {
    fprintf((FILE *)this->out,"    (void)%s;\n","_a");
  }
  fwrite("}\n",2,1,(FILE *)this->out);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_90);
  QArrayDataPointer<FunctionDef>::~QArrayDataPointer
            ((QArrayDataPointer<FunctionDef> *)(local_88 + 0x20));
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generateStaticMetacall()
{
    fprintf(out, "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
            cdef->qualified.constData());

    enum UsedArgs {
        UsedT = 1,
        UsedC = 2,
        UsedId = 4,
        UsedA = 8,
    };
    uint usedArgs = 0;

    if (cdef->hasQObject) {
#ifndef QT_NO_DEBUG
        fprintf(out, "    Q_ASSERT(_o == nullptr || staticMetaObject.cast(_o));\n");
#endif
        fprintf(out, "    auto *_t = static_cast<%s *>(_o);\n", cdef->classname.constData());
    } else {
        fprintf(out, "    auto *_t = reinterpret_cast<%s *>(_o);\n", cdef->classname.constData());
    }

    const auto generateCtorArguments = [&](int ctorindex) {
        const FunctionDef &f = cdef->constructorList.at(ctorindex);
        Q_ASSERT(!f.isPrivateSignal); // That would be a strange ctor indeed
        int offset = 1;

        const auto begin = f.arguments.cbegin();
        const auto end = f.arguments.cend();
        for (auto it = begin; it != end; ++it) {
            const ArgumentDef &a = *it;
            if (it != begin)
                fprintf(out, ",");
            fprintf(out, "(*reinterpret_cast<%s>(_a[%d]))",
                    a.typeNameForCast.constData(), offset++);
        }
    };

    if (!cdef->constructorList.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::CreateInstance) {\n");
        fprintf(out, "        switch (_id) {\n");
        const int ctorend = int(cdef->constructorList.size());
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { %s *_r = new %s(", ctorindex,
                    cdef->classname.constData(), cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, ");\n");
            fprintf(out, "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",
                    (cdef->hasQGadget || cdef->hasQNamespace) ? "void" : "QObject");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        fprintf(out, "    if (_c == QMetaObject::ConstructInPlace) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { new (_a[0]) %s(",
                    ctorindex, cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, "); } break;\n");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    if (!methodList.isEmpty()) {
        usedArgs |= UsedT | UsedC | UsedId;
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int methodindex = 0; methodindex < methodList.size(); ++methodindex) {
            const FunctionDef &f = methodList.at(methodindex);
            Q_ASSERT(!f.normalizedType.isEmpty());
            fprintf(out, "        case %d: ", methodindex);
            if (f.normalizedType != "void")
                fprintf(out, "{ %s _r = ", noRef(f.normalizedType).constData());
            fprintf(out, "_t->");
            if (f.inPrivateClass.size())
                fprintf(out, "%s->", f.inPrivateClass.constData());
            fprintf(out, "%s(", f.name.constData());
            int offset = 1;

            if (f.isRawSlot) {
                fprintf(out, "QMethodRawArguments{ _a }");
                usedArgs |= UsedA;
            } else {
                const auto begin = f.arguments.cbegin();
                const auto end = f.arguments.cend();
                for (auto it = begin; it != end; ++it) {
                    const ArgumentDef &a = *it;
                    if (it != begin)
                        fprintf(out, ",");
                    fprintf(out, "(*reinterpret_cast< %s>(_a[%d]))",a.typeNameForCast.constData(), offset++);
                    usedArgs |= UsedA;
                }
                if (f.isPrivateSignal) {
                    if (!f.arguments.isEmpty())
                        fprintf(out, ", ");
                    fprintf(out, "%s", "QPrivateSignal()");
                }
            }
            fprintf(out, ");");
            if (f.normalizedType != "void") {
                fprintf(out, "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                        noRef(f.normalizedType).constData());
                usedArgs |= UsedA;
            }
            fprintf(out, " break;\n");
        }
        fprintf(out, "        default: ;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");

        QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes = methodsWithAutomaticTypesHelper(methodList);

        if (!methodsWithAutomaticTypes.isEmpty()) {
            fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
            fprintf(out, "        switch (_id) {\n");
            fprintf(out, "        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
            QMap<int, QMultiMap<QByteArray, int> >::const_iterator it = methodsWithAutomaticTypes.constBegin();
            const QMap<int, QMultiMap<QByteArray, int> >::const_iterator end = methodsWithAutomaticTypes.constEnd();
            for ( ; it != end; ++it) {
                fprintf(out, "        case %d:\n", it.key());
                fprintf(out, "            switch (*reinterpret_cast<int*>(_a[1])) {\n");
                fprintf(out, "            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
                auto jt = it->begin();
                const auto jend = it->end();
                while (jt != jend) {
                    fprintf(out, "            case %d:\n", jt.value());
                    const QByteArray &lastKey = jt.key();
                    ++jt;
                    if (jt == jend || jt.key() != lastKey)
                        fprintf(out, "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n", lastKey.constData());
                }
                fprintf(out, "            }\n");
                fprintf(out, "            break;\n");
            }
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
            usedArgs |= UsedC | UsedId | UsedA;
        }

    }
    if (!cdef->signalList.isEmpty()) {
        usedArgs |= UsedC | UsedA;
        fprintf(out, "    if (_c == QMetaObject::IndexOfMethod) {\n");
        for (int methodindex = 0; methodindex < int(cdef->signalList.size()); ++methodindex) {
            const FunctionDef &f = cdef->signalList.at(methodindex);
            if (f.wasCloned || !f.inPrivateClass.isEmpty() || f.isStatic)
                continue;
            fprintf(out, "        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",
                    f.type.rawName.constData() , cdef->classname.constData());

            const auto begin = f.arguments.cbegin();
            const auto end = f.arguments.cend();
            for (auto it = begin; it != end; ++it) {
                const ArgumentDef &a = *it;
                if (it != begin)
                    fprintf(out, ", ");
                fprintf(out, "%s", QByteArray(a.type.name + ' ' + a.rightType).constData());
            }
            if (f.isPrivateSignal) {
                if (!f.arguments.isEmpty())
                    fprintf(out, ", ");
                fprintf(out, "%s", "QPrivateSignal");
            }
            fprintf(out, ")%s>(_a, &%s::%s, %d))\n",
                    f.isConst ? " const" : "",
                    cdef->classname.constData(), f.name.constData(), methodindex);
            fprintf(out, "            return;\n");
        }
        fprintf(out, "    }\n");
    }

    const QMultiMap<QByteArray, int> automaticPropertyMetaTypes = automaticPropertyMetaTypesHelper();

    if (!automaticPropertyMetaTypes.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::RegisterPropertyMetaType) {\n");
        fprintf(out, "        switch (_id) {\n");
        fprintf(out, "        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n");
        auto it = automaticPropertyMetaTypes.begin();
        const auto end = automaticPropertyMetaTypes.end();
        while (it != end) {
            fprintf(out, "        case %d:\n", it.value());
            const QByteArray &lastKey = it.key();
            ++it;
            if (it == end || it.key() != lastKey)
                fprintf(out, "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n", lastKey.constData());
        }
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    if (!cdef->propertyList.empty()) {
        bool needGet = false;
        bool needTempVarForGet = false;
        bool needSet = false;
        bool needReset = false;
        bool hasBindableProperties = false;
        for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
            needGet |= !p.read.isEmpty() || !p.member.isEmpty();
            if (!p.read.isEmpty() || !p.member.isEmpty())
                needTempVarForGet |= (p.gspec != PropertyDef::PointerSpec
                                      && p.gspec != PropertyDef::ReferenceSpec);

            needSet |= !p.write.isEmpty() || (!p.member.isEmpty() && !p.constant);
            needReset |= !p.reset.isEmpty();
            hasBindableProperties |= !p.bind.isEmpty();
        }
        if (needGet || needSet || hasBindableProperties || needReset)
            usedArgs |= UsedT | UsedC | UsedId;
        if (needGet || needSet || hasBindableProperties)
            usedArgs |= UsedA;  // resetting doesn't need arguments

        if (needGet) {
            fprintf(out, "    if (_c == QMetaObject::ReadProperty) {\n");
            if (needTempVarForGet)
                fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.read.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }

                if (p.gspec == PropertyDef::PointerSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
                else if (p.gspec == PropertyDef::ReferenceSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
                else if (auto eflags = cdef->enumDeclarations.value(p.type); eflags & EnumIsFlag)
                    fprintf(out, "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n",
                            propindex, p.type.constData(), prefix.constData(), p.read.constData());
#endif
                else if (p.read == "default")
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.bind.constData());
                else if (!p.read.isEmpty())
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.read.constData());
                else
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.member.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needSet) {
            fprintf(out, "    if (_c == QMetaObject::WriteProperty) {\n");
            fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.constant)
                    continue;
                if (p.write.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                if (p.write == "default") {
                    fprintf(out, "        case %d: {\n", propindex);
                    fprintf(out, "            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",
                            prefix.constData(), p.bind.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    fprintf(out, "            break;\n");
                    fprintf(out, "        }\n");
                } else if (!p.write.isEmpty()) {
                    fprintf(out, "        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                            propindex, prefix.constData(), p.write.constData(),
                            cxxTypeTag(p.typeTag), p.type.constData());
                } else {
                    fprintf(out, "        case %d:", propindex);
                    if (p.notify.isEmpty()) {
                        fprintf(out, " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    } else {
                        fprintf(out, "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                        fprintf(out, "                Q_EMIT _t->%s(", p.notify.constData());
                        if (p.notifyId > -1) {
                            const FunctionDef &f = cdef->signalList.at(p.notifyId);
                            if (f.arguments.size() == 1 && f.arguments.at(0).normalizedType == p.type)
                                fprintf(out, "%s%s", prefix.constData(), p.member.constData());
                        }
                        fprintf(out, ");\n");
                        fprintf(out, "            break;\n");
                    }
                }
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needReset) {
            fprintf(out, "if (_c == QMetaObject::ResetProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.reset.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out, "        case %d: %s%s(); break;\n",
                        propindex, prefix.constData(), p.reset.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (hasBindableProperties) {
            fprintf(out, "    if (_c == QMetaObject::BindableProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.bind.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out,
                        "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); "
                        "break;\n",
                        propindex, prefix.constData(), p.bind.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }
    }

    auto printUnused = [&](UsedArgs entry, const char *name) {
        if ((usedArgs & entry) == 0)
            fprintf(out, "    (void)%s;\n", name);
    };
    printUnused(UsedT, "_t");
    printUnused(UsedC, "_c");
    printUnused(UsedId, "_id");
    printUnused(UsedA, "_a");

    fprintf(out, "}\n");
}